

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O1

int __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder::bind
          (Binder *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  ArrayMapEntry<Kernel::TermList> *pAVar1;
  uint uVar2;
  GenMatcher *this_00;
  ArrayMapEntry<Kernel::TermList> *pAVar3;
  int iVar4;
  uint *puVar5;
  
  if (this->_maxVar < (uint)__fd) {
    return 0;
  }
  this_00 = this->_parent;
  pAVar3 = (this_00->_bindings).super_DArray<Lib::ArrayMapEntry<Kernel::TermList>_>._array;
  pAVar1 = pAVar3 + (uint)__fd;
  uVar2 = (this_00->_bindings)._timestamp;
  if (pAVar3[(uint)__fd]._timestamp == uVar2) {
    iVar4 = (int)CONCAT71((int7)((ulong)pAVar1 >> 8),(sockaddr *)(pAVar1->_obj)._content == __addr);
  }
  else {
    pAVar1->_timestamp = uVar2;
    (pAVar1->_obj)._content = (uint64_t)__addr;
    if ((this_00->_boundVars)._cursor == (this_00->_boundVars)._end) {
      ::Lib::Stack<unsigned_int>::expand(&this_00->_boundVars);
    }
    puVar5 = (this_00->_boundVars)._cursor;
    *puVar5 = __fd;
    puVar5 = puVar5 + 1;
    (this_00->_boundVars)._cursor = puVar5;
    iVar4 = (int)CONCAT71((int7)((ulong)puVar5 >> 8),1);
  }
  return iVar4;
}

Assistant:

bool bind(unsigned var, TermList term)
  {
    if(var > _maxVar) {
      return false;
    }
    TermList* aux;
    if(_parent->_bindings.getValuePtr(var,aux,term)) {
      _parent->_boundVars.push(var);
      return true;
    } else {
      return *aux==term;
    }
  }